

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,JointPolicyPureVectorForClusteredBG *this)

{
  Interface_ProblemToPolicyDiscretePure *pIVar1;
  ostream *poVar2;
  E *this_00;
  stringstream ss;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared((JointPolicyDiscretePure *)local_1a0);
  if ((_func_int **)local_1a0._0_8_ == (_func_int **)0x0) {
    pIVar1 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure((JointPolicyDiscretePure *)this);
    boost::detail::shared_count::~shared_count((shared_count *)(local_1a0 + 8));
    if (pIVar1 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"JointPolicyPureVectorForClusteredBG:SoftPrintBrief - Error!!! PTPDP==0");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
  }
  else {
    boost::detail::shared_count::~shared_count((shared_count *)(local_1a0 + 8));
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1a0 + 0x10),"JPPV4CBG_d",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1a0 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_cur",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_prev",5);
  std::ostream::_M_insert<void_const*>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrintBrief() const
{
    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrintBrief - Error!!! PTPDP==0");
            
    stringstream ss;
    ss << "JPPV4CBG_d"<<GetDepth() << "_cur" << this << "_prev" << _m_prevJPolBG;
    return(ss.str());
}